

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpComms::setFlag(TcpComms *this,string_view flag,bool val)

{
  bool bVar1;
  long *plVar2;
  
  plVar2 = (long *)flag._M_str;
  if (flag._M_len == 9) {
    if ((char)plVar2[1] != 'd' || *plVar2 != 0x6574707972636e65) goto LAB_002bedcb;
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    (this->super_NetworkCommsInterface).encrypted = val;
  }
  else {
    if ((flag._M_len != 0xd) ||
       (*(long *)((long)plVar2 + 5) != 0x737365726464615f || *plVar2 != 0x64615f6573756572)) {
LAB_002bedcb:
      NetworkCommsInterface::setFlag(&this->super_NetworkCommsInterface,flag,val);
      return;
    }
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->reuse_address = val;
  }
  CommsInterface::propertyUnLock((CommsInterface *)this);
  return;
}

Assistant:

void TcpComms::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}